

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::parseVpfxdParameter(MipsParser *this,Parser *parser,int *result)

{
  int iVar1;
  bool bVar2;
  Token *pTVar3;
  byte bVar4;
  int i;
  int iVar5;
  TokenSequence tokens;
  TokenSequence tokens_00;
  TokenSequence tokens_01;
  TokenSequence tokens_02;
  TokenSequence tokens_03;
  TokenSequence tokens_04;
  TokenSequence tokens_05;
  TokenSequence tokens_06;
  TokenValueSequence values;
  TokenValueSequence values_00;
  TokenValueSequence values_01;
  TokenValueSequence values_02;
  TokenValueSequence values_03;
  TokenValueSequence values_04;
  TokenValueSequence values_05;
  TokenValueSequence values_06;
  TokenType local_68 [6];
  int num;
  anon_union_8_3_8ee6f037_for_TokenSequenceValue_1 local_48;
  int local_40;
  char *local_38;
  
  if ((parseVpfxdParameter(Parser&,int&)::sequenceParser == '\0') &&
     (iVar5 = __cxa_guard_acquire(&parseVpfxdParameter(Parser&,int&)::sequenceParser), iVar5 != 0))
  {
    parseVpfxdParameter::sequenceParser.entries.
    super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parseVpfxdParameter::sequenceParser.entries.
    super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parseVpfxdParameter::sequenceParser.entries.
    super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(TokenSequenceParser::~TokenSequenceParser,&parseVpfxdParameter::sequenceParser,
                 &__dso_handle);
    __cxa_guard_release(&parseVpfxdParameter(Parser&,int&)::sequenceParser);
  }
  if (parseVpfxdParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      parseVpfxdParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_68[0] = Integer;
    local_68[1] = Minus;
    iVar5 = 2;
    local_48.textValue = (char *)0x0;
    local_68[2] = 2;
    local_38 = (char *)0x1;
    tokens._M_len = 3;
    tokens._M_array = local_68;
    values._M_len = 2;
    values._M_array = (iterator)&num;
    num = iVar5;
    local_40 = iVar5;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,1,tokens,values);
    local_68[0] = Integer;
    local_68[1] = Minus;
    local_48.textValue = (char *)0x0;
    local_68[2] = 0x27;
    local_38 = "1m";
    tokens_00._M_len = 3;
    tokens_00._M_array = local_68;
    values_00._M_len = 2;
    values_00._M_array = (iterator)&num;
    num = iVar5;
    local_40 = 1;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-1,tokens_00,values_00);
    local_48.textValue = (char *)0x0;
    local_68[0] = Integer;
    local_68[1] = Colon;
    local_68[2] = 2;
    local_38 = (char *)0x1;
    tokens_01._M_len = 3;
    tokens_01._M_array = local_68;
    values_01._M_len = 2;
    values_01._M_array = (iterator)&num;
    num = iVar5;
    local_40 = iVar5;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,1,tokens_01,values_01);
    local_48.textValue = (char *)0x0;
    local_68[0] = Integer;
    local_68[1] = Colon;
    local_68[2] = 0x27;
    local_38 = "1m";
    tokens_02._M_len = 3;
    tokens_02._M_array = local_68;
    values_02._M_len = 2;
    values_02._M_array = (iterator)&num;
    num = iVar5;
    local_40 = 1;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-1,tokens_02,values_02);
    local_68[0] = Minus;
    local_68[1] = Integer;
    local_68[2] = Minus;
    local_68[3] = Integer;
    local_48.intValue = 1;
    local_38 = (char *)0x1;
    tokens_03._M_len = 4;
    tokens_03._M_array = local_68;
    values_03._M_len = 2;
    values_03._M_array = (iterator)&num;
    num = iVar5;
    local_40 = iVar5;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,3,tokens_03,values_03);
    local_68[0] = Minus;
    local_68[1] = Integer;
    local_68[2] = Minus;
    local_68[3] = NumberString;
    local_48.intValue = 1;
    local_40 = 1;
    local_38 = "1m";
    tokens_04._M_len = 4;
    tokens_04._M_array = local_68;
    values_04._M_len = 2;
    values_04._M_array = (iterator)&num;
    num = iVar5;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-3,tokens_04,values_04);
    local_68[0] = Minus;
    local_68[1] = Integer;
    local_68[2] = Colon;
    local_68[3] = Integer;
    local_48.intValue = 1;
    local_38 = (char *)0x1;
    tokens_05._M_len = 4;
    tokens_05._M_array = local_68;
    values_05._M_len = 2;
    values_05._M_array = (iterator)&num;
    num = iVar5;
    local_40 = iVar5;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,3,tokens_05,values_05);
    local_68[0] = Minus;
    local_68[1] = Integer;
    local_68[2] = Colon;
    local_68[3] = NumberString;
    local_48.intValue = 1;
    local_40 = 1;
    local_38 = "1m";
    tokens_06._M_len = 4;
    tokens_06._M_array = local_68;
    values_06._M_len = 2;
    values_06._M_array = (iterator)&num;
    num = iVar5;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-3,tokens_06,values_06);
  }
  bVar4 = 0;
  iVar5 = 0;
  do {
    if (iVar5 != 0) {
      if (iVar5 == 4) {
        pTVar3 = Parser::nextToken(parser);
        return pTVar3->type == RBrack;
      }
      pTVar3 = Parser::nextToken(parser);
      if (pTVar3->type != Comma) {
        return false;
      }
    }
    Parser::eatToken(parser);
    num = 0;
    bVar2 = TokenSequenceParser::parse(&parseVpfxdParameter::sequenceParser,parser,&num);
    if (!bVar2) {
      return false;
    }
    iVar1 = -num;
    if (0 < num) {
      iVar1 = num;
    }
    *result = iVar1 << (bVar4 & 0x1f) | num >> 0x1f & 0x100 << ((byte)iVar5 & 0x1f) | *result;
    iVar5 = iVar5 + 1;
    bVar4 = bVar4 + 2;
  } while( true );
}

Assistant:

bool MipsParser::parseVpfxdParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// 0-1
		sequenceParser.addEntry(1,
			{TokenType::Integer, TokenType::Minus, TokenType::Integer},
			{INT64_C(0), INT64_C(1)} );
		// 0-1
		sequenceParser.addEntry(-1,
			{TokenType::Integer, TokenType::Minus, TokenType::NumberString},
			{INT64_C(0), "1m"} );
		// 0:1
		sequenceParser.addEntry(1,
			{TokenType::Integer, TokenType::Colon, TokenType::Integer},
			{INT64_C(0), INT64_C(1)} );
		// 0:1
		sequenceParser.addEntry(-1,
			{TokenType::Integer, TokenType::Colon, TokenType::NumberString},
			{INT64_C(0), "1m"} );
		// -1-1
		sequenceParser.addEntry(3,
			{TokenType::Minus, TokenType::Integer, TokenType::Minus, TokenType::Integer},
			{INT64_C(1), INT64_C(1)} );
		// -1-1m
		sequenceParser.addEntry(-3,
			{TokenType::Minus, TokenType::Integer, TokenType::Minus, TokenType::NumberString},
			{INT64_C(1), "1m"} );
		// -1:1
		sequenceParser.addEntry(3,
			{TokenType::Minus, TokenType::Integer, TokenType::Colon, TokenType::Integer},
			{INT64_C(1), INT64_C(1)} );
		// -1:1m
		sequenceParser.addEntry(-3,
			{TokenType::Minus, TokenType::Integer, TokenType::Colon, TokenType::NumberString},
			{INT64_C(1), "1m"} );
	}

	for (int i = 0; i < 4; i++)
	{
		if (i != 0)
		{
			if (parser.nextToken().type != TokenType::Comma)
				return false;
		}

		parser.eatToken();
		
		int num = 0;
		if (!sequenceParser.parse(parser,num))
			return false;

		// m versions
		if (num < 0)
		{
			result |= 1 << (8+i);
			num = abs(num);
		}

		result |= num << (2*i);
	}
	
	return parser.nextToken().type == TokenType::RBrack;
}